

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farchive.cpp
# Opt level: O2

void __thiscall FArchive::WriteCount(FArchive *this,DWORD count)

{
  bool bVar1;
  byte local_29;
  
  do {
    local_29 = (0x7f < count) << 7 | (byte)count & 0x7f;
    (*this->_vptr_FArchive[2])(this,&local_29,1);
    bVar1 = 0x7f < count;
    count = count >> 7;
  } while (bVar1);
  return;
}

Assistant:

void FArchive::WriteCount (DWORD count)
{
	BYTE out;

	do
	{
		out = count & 0x7f;
		if (count >= 0x80)
			out |= 0x80;
		Write (&out, sizeof(BYTE));
		count >>= 7;
	} while (count);

}